

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfsbfs.cpp
# Opt level: O1

void bfs(int u,vector<int,_std::allocator<int>_> *distance,vector<int,_std::allocator<int>_> *path)

{
  ulong *puVar1;
  int iVar2;
  int *piVar3;
  pointer piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  int to;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_90;
  int local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  vector<int,_std::allocator<int>_> *local_38;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (int *)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_8c = u;
  local_38 = distance;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
              ((deque<int,std::allocator<int>> *)&local_88,&local_8c);
  }
  else {
    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_8c;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  uVar7 = (ulong)local_8c;
  uVar5 = uVar7 + 0x3f;
  if (-1 < (long)uVar7) {
    uVar5 = uVar7;
  }
  puVar1 = (ulong *)(((long)uVar5 >> 6) * 8 + (anonymous_namespace)::usedbfs + -8 +
                    (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001) * 8);
  *puVar1 = *puVar1 | 1L << ((byte)local_8c & 0x3f);
  (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [uVar7] = -1;
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    do {
      iVar2 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
      }
      piVar3 = edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar2].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar9 = edge.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar2].
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start; piVar9 != piVar3; piVar9 = piVar9 + 1) {
        local_90 = *piVar9;
        uVar7 = (ulong)local_90;
        uVar5 = uVar7 + 0x3f;
        if (-1 < (long)uVar7) {
          uVar5 = uVar7;
        }
        lVar6 = ((long)uVar5 >> 6) * 8 + (anonymous_namespace)::usedbfs;
        uVar8 = (ulong)((uVar7 & 0x800000000000003f) < 0x8000000000000001);
        uVar5 = *(ulong *)(lVar6 + -8 + uVar8 * 8);
        if ((uVar5 >> (uVar7 & 0x3f) & 1) == 0) {
          *(ulong *)(lVar6 + uVar8 * 8 + -8) = uVar5 | 1L << ((byte)local_90 & 0x3f);
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)&local_88,&local_90);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
          piVar4 = (local_38->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4[local_90] = piVar4[iVar2] + 1;
          (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_90] = iVar2;
        }
      }
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return;
}

Assistant:

void bfs(int u, vector<int> &distance, vector<int> &path) {
    queue<int> q;
    q.push(u);
    usedbfs[u] = true;
    path[u] = -1;
    while (!q.empty()) {
        int u = q.front();
        q.pop();
        for (int to : edge[u]) {
            if (!usedbfs[to]) {
                usedbfs[to] = true;
                q.push(to);
                distance[to] = distance[u] + 1;
                path[to] = u;
            }
        }
    }
}